

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockAlpha16bitC
               (uint8 *data,uint8 *img,int width,int height,int ix,int iy,int channels)

{
  byte bVar1;
  int16 iVar2;
  uint16 uVar3;
  uint uVar4;
  int iVar5;
  int in_EDX;
  long in_RSI;
  byte *in_RDI;
  int in_R8D;
  int in_R9D;
  int windex;
  int bitpos;
  int index;
  int y;
  int x;
  int byte;
  int bit;
  int table;
  int alpha;
  int local_40;
  uint local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  uint local_24;
  
  local_24 = (uint)*in_RDI;
  uVar4 = (uint)in_RDI[1];
  if (formatSigned != 0) {
    local_24 = (int)(char)*in_RDI + 0x80;
  }
  local_2c = 0;
  local_30 = 2;
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      local_3c = 0;
      for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
        bVar1 = getbit(in_RDI[local_30],7 - local_2c,2 - local_40);
        local_3c = bVar1 | local_3c;
        local_2c = local_2c + 1;
        if (7 < local_2c) {
          local_2c = 0;
          local_30 = local_30 + 1;
        }
      }
      iVar5 = bitpos * (in_R8D + local_34 + (in_R9D + local_38) * in_EDX) * 2;
      if (formatSigned == 0) {
        uVar3 = get16bits11bits(local_24,uVar4 % 0x10,uVar4 / 0x10,local_3c);
        *(uint16 *)(in_RSI + iVar5) = uVar3;
      }
      else {
        iVar2 = get16bits11signed(local_24,uVar4 % 0x10,uVar4 / 0x10,local_3c);
        *(int16 *)(in_RSI + iVar5) = iVar2;
      }
    }
  }
  return;
}

Assistant:

void decompressBlockAlpha16bitC(uint8* data, uint8* img, int width, int height, int ix, int iy, int channels) 
{
	int alpha = data[0];
	int table = data[1];

	if(formatSigned) 
	{
		//if we have a signed format, the base value is given as a signed byte. We convert it to (0-255) here,
		//so more code can be shared with the unsigned mode.
		alpha = *((signed char*)(&data[0]));
		alpha = alpha+128;
	}

	int bit=0;
	int byte=2;
	//extract an alpha value for each pixel.
	for(int x=0; x<4; x++) 
	{
		for(int y=0; y<4; y++) 
		{
			//Extract table index
			int index=0;
			for(int bitpos=0; bitpos<3; bitpos++) 
			{
				index|=getbit(data[byte],7-bit,2-bitpos);
				bit++;
				if(bit>7) 
				{
					bit=0;
					byte++;
				}
			}
			int windex = channels*(2*(ix+x+(iy+y)*width));
#if !PGMOUT
			if(formatSigned)
			{
				*(int16 *)&img[windex] = get16bits11signed(alpha,(table%16),(table/16),index);
			}
			else
			{
				*(uint16 *)&img[windex] = get16bits11bits(alpha,(table%16),(table/16),index);
			}
#else
			//make data compatible with the .pgm format. See the comment in compressBlockAlpha16() for details.
			uint16 uSixteen;
			if (formatSigned)
			{
				//the pgm-format only allows unsigned images,
				//so we add 2^15 to get a 16-bit value.
				uSixteen = get16bits11signed(alpha,(table%16),(table/16),index) + 256*128;
			}
			else
			{
				uSixteen = get16bits11bits(alpha,(table%16),(table/16),index);
			}
			//byte swap for pgm
			img[windex] = uSixteen/256;
			img[windex+1] = uSixteen%256;
#endif

		}
	}			
}